

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManCreateLiterals(Fx_Man_t *p,int nVars)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *p_00;
  int local_2c;
  int Count;
  int Lit;
  int k;
  int i;
  Vec_Int_t *vCube;
  int nVars_local;
  Fx_Man_t *p_local;
  
  p->nLits = 0;
  p->nVars = 0;
  for (Lit = 0; iVar1 = Vec_WecSize(p->vCubes), Lit < iVar1; Lit = Lit + 1) {
    pVVar3 = Vec_WecEntry(p->vCubes,Lit);
    iVar1 = Vec_IntSize(pVVar3);
    if (iVar1 < 1) {
      __assert_fail("Vec_IntSize(vCube) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                    ,0x2f3,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
    }
    iVar1 = p->nVars;
    iVar2 = Vec_IntEntry(pVVar3,0);
    iVar1 = Abc_MaxInt(iVar1,iVar2);
    p->nVars = iVar1;
    iVar1 = Vec_IntSize(pVVar3);
    p->nLits = iVar1 + -1 + p->nLits;
    for (Count = 1; iVar1 = Vec_IntSize(pVVar3), Count < iVar1; Count = Count + 1) {
      iVar2 = Vec_IntEntry(pVVar3,Count);
      iVar1 = p->nVars;
      iVar2 = Abc_Lit2Var(iVar2);
      iVar1 = Abc_MaxInt(iVar1,iVar2);
      p->nVars = iVar1;
    }
  }
  if (nVars <= p->nVars) {
    __assert_fail("p->nVars < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                  ,0x2fa,"void Fx_ManCreateLiterals(Fx_Man_t *, int)");
  }
  p->nVars = nVars;
  pVVar3 = Vec_IntStart(p->nVars << 1);
  p->vCounts = pVVar3;
  for (Lit = 0; iVar1 = Vec_WecSize(p->vCubes), Lit < iVar1; Lit = Lit + 1) {
    pVVar3 = Vec_WecEntry(p->vCubes,Lit);
    for (Count = 1; iVar1 = Vec_IntSize(pVVar3), Count < iVar1; Count = Count + 1) {
      iVar1 = Vec_IntEntry(pVVar3,Count);
      Vec_IntAddToEntry(p->vCounts,iVar1,1);
    }
  }
  pVVar4 = Vec_WecStart(p->nVars << 1);
  p->vLits = pVVar4;
  for (local_2c = 0; iVar1 = Vec_IntSize(p->vCounts), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(p->vCounts,local_2c);
    pVVar3 = Vec_WecEntry(p->vLits,local_2c);
    Vec_IntGrow(pVVar3,iVar1);
  }
  for (Lit = 0; iVar1 = Vec_WecSize(p->vCubes), Lit < iVar1; Lit = Lit + 1) {
    pVVar3 = Vec_WecEntry(p->vCubes,Lit);
    for (Count = 1; iVar1 = Vec_IntSize(pVVar3), Count < iVar1; Count = Count + 1) {
      iVar1 = Vec_IntEntry(pVVar3,Count);
      Vec_WecPush(p->vLits,iVar1,Lit);
    }
  }
  pVVar3 = Vec_IntStartFull(p->nVars);
  p->vVarCube = pVVar3;
  for (Lit = 0; iVar1 = Vec_WecSize(p->vCubes), Lit < iVar1; Lit = Lit + 1) {
    p_00 = Vec_WecEntry(p->vCubes,Lit);
    pVVar3 = p->vVarCube;
    iVar1 = Vec_IntEntry(p_00,0);
    iVar1 = Vec_IntEntry(pVVar3,iVar1);
    if (iVar1 == -1) {
      pVVar3 = p->vVarCube;
      iVar1 = Vec_IntEntry(p_00,0);
      Vec_IntWriteEntry(pVVar3,iVar1,Lit);
    }
  }
  return;
}

Assistant:

void Fx_ManCreateLiterals( Fx_Man_t * p, int nVars )
{
    Vec_Int_t * vCube;
    int i, k, Lit, Count;
    // find the number of variables
    p->nVars = p->nLits = 0;
    Vec_WecForEachLevel( p->vCubes, vCube, i )
    {
        assert( Vec_IntSize(vCube) > 0 );
        p->nVars = Abc_MaxInt( p->nVars, Vec_IntEntry(vCube, 0) );
        p->nLits += Vec_IntSize(vCube) - 1;
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            p->nVars = Abc_MaxInt( p->nVars, Abc_Lit2Var(Lit) );
    }
//    p->nVars++;
    assert( p->nVars < nVars );
    p->nVars = nVars;
    // count literals
    p->vCounts = Vec_IntStart( 2*p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_IntAddToEntry( p->vCounts, Lit, 1 );
    // start literals
    p->vLits = Vec_WecStart( 2*p->nVars );
    Vec_IntForEachEntry( p->vCounts, Count, Lit )
        Vec_IntGrow( Vec_WecEntry(p->vLits, Lit), Count );
    // fill out literals
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Vec_IntForEachEntryStart( vCube, Lit, k, 1 )
            Vec_WecPush( p->vLits, Lit, i );
    // create mapping of variable into the first cube
    p->vVarCube = Vec_IntStartFull( p->nVars );
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        if ( Vec_IntEntry(p->vVarCube, Vec_IntEntry(vCube, 0)) == -1 )
            Vec_IntWriteEntry( p->vVarCube, Vec_IntEntry(vCube, 0), i );
}